

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

void __thiscall
kratos::Generator::add_child_generator(Generator *this,string *instance_name_,Generator *child)

{
  __shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<kratos::Generator,void>
            (local_30,(__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
                      &child->super_enable_shared_from_this<kratos::Generator>);
  add_child_generator(this,instance_name_,(shared_ptr<kratos::Generator> *)local_30);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return;
}

Assistant:

void Generator::add_child_generator(const std::string &instance_name_, Generator &child) {
    add_child_generator(instance_name_, child.shared_from_this());
}